

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::copy_ptr<const_libtorrent::file_storage>::copy_ptr
          (copy_ptr<const_libtorrent::file_storage> *this,
          copy_ptr<const_libtorrent::file_storage> *p)

{
  bool bVar1;
  type pfVar2;
  undefined8 local_58;
  copy_ptr<const_libtorrent::file_storage> *p_local;
  copy_ptr<const_libtorrent::file_storage> *this_local;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)p);
  if (bVar1) {
    local_58 = (file_storage *)operator_new(0xb8);
    pfVar2 = ::std::
             unique_ptr<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
             ::operator*(&p->m_ptr);
    file_storage::file_storage(local_58,pfVar2);
  }
  else {
    local_58 = (pointer)0x0;
  }
  ::std::
  unique_ptr<libtorrent::file_storage_const,std::default_delete<libtorrent::file_storage_const>>::
  unique_ptr<std::default_delete<libtorrent::file_storage_const>,void>
            ((unique_ptr<libtorrent::file_storage_const,std::default_delete<libtorrent::file_storage_const>>
              *)this,local_58);
  return;
}

Assistant:

copy_ptr(copy_ptr const& p): m_ptr(p.m_ptr ? new T(*p.m_ptr) : nullptr) {}